

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O2

void anon_unknown.dwarf_f6ec::cmakemainProgressCallback(string *m,float prog,cmake *cm)

{
  bool bVar1;
  cmMakefile *this;
  string *psVar2;
  ostream *poVar3;
  cmake *cm_00;
  string_view str;
  string_view str_00;
  string dir;
  char local_5d;
  float local_5c;
  string local_58;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  local_5c = prog;
  this = cmakemainGetMakefile(cm);
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = 0;
  if (this != (cmMakefile *)0x0) {
    str._M_str = (m->_M_dataplus)._M_p;
    str._M_len = m->_M_string_length;
    bVar1 = cmHasLiteralPrefix<12ul>(str,(char (*) [12])"Configuring");
    if (!bVar1 || 0.0 <= local_5c) {
      str_00._M_str = (m->_M_dataplus)._M_p;
      str_00._M_len = m->_M_string_length;
      bVar1 = cmHasLiteralPrefix<11ul>(str_00,(char (*) [11])"Generating");
      if (!bVar1) goto LAB_0017f5be;
      local_5d = ' ';
      psVar2 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
      cmStrCat<char,std::__cxx11::string_const&>(&local_58,&local_5d,psVar2);
    }
    else {
      local_5d = ' ';
      psVar2 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
      cmStrCat<char,std::__cxx11::string_const&>(&local_58,&local_5d,psVar2);
    }
    std::__cxx11::string::operator=((string *)&local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
LAB_0017f5be:
  if ((local_5c < 0.0) || (local_30 != 0)) {
    poVar3 = std::operator<<((ostream *)&std::cout,"-- ");
    poVar3 = std::operator<<(poVar3,(string *)m);
    poVar3 = std::operator<<(poVar3,(string *)&local_38);
    (anonymous_namespace)::cmakemainGetStack_abi_cxx11_(&local_58,(_anonymous_namespace_ *)cm,cm_00)
    ;
    poVar3 = std::operator<<(poVar3,(string *)&local_58);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmakemainProgressCallback(const std::string& m, float prog, cmake* cm)
{
  cmMakefile* mf = cmakemainGetMakefile(cm);
  std::string dir;
  if (mf && cmHasLiteralPrefix(m, "Configuring") && (prog < 0)) {
    dir = cmStrCat(' ', mf->GetCurrentSourceDirectory());
  } else if (mf && cmHasLiteralPrefix(m, "Generating")) {
    dir = cmStrCat(' ', mf->GetCurrentBinaryDirectory());
  }

  if ((prog < 0) || (!dir.empty())) {
    std::cout << "-- " << m << dir << cmakemainGetStack(cm) << std::endl;
  }
}